

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::Arguments::~Arguments(Arguments *this)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_20;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_18;
  iterator i;
  Arguments *this_local;
  
  i._M_current = (char **)this;
  local_18._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(&this->args_);
  while( true ) {
    local_20._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::end(&this->args_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&local_18);
    free(*ppcVar2);
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&local_18);
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector(&this->args_);
  return;
}

Assistant:

~Arguments() {
    for (std::vector<char*>::iterator i = args_.begin(); i != args_.end();
         ++i) {
      free(*i);
    }
  }